

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BraIA64.c
# Opt level: O3

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  byte bVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  uint uVar12;
  byte *pbVar13;
  ulong uVar14;
  Byte *pBVar15;
  undefined1 auVar16 [16];
  long lVar17;
  
  auVar4 = _DAT_0073b300;
  auVar3 = _DAT_0073b2f0;
  if (size < 0x10) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0;
    pBVar15 = data;
    do {
      uVar8 = ip + (int)uVar5;
      uVar2 = -uVar8;
      if (encoding != 0) {
        uVar2 = uVar8;
      }
      bVar1 = ""[data[uVar5] & 0x1f];
      uVar9 = 5;
      uVar8 = 0;
      do {
        if ((bVar1 >> (uVar8 & 0x1f) & 1) != 0) {
          pbVar13 = pBVar15 + (uVar9 >> 3);
          lVar7 = 0;
          uVar14 = 0;
          pbVar10 = pbVar13;
          do {
            uVar14 = uVar14 + ((ulong)*pbVar10 << ((byte)lVar7 & 0x3f));
            pbVar10 = pbVar10 + 1;
            lVar7 = lVar7 + 8;
          } while (lVar7 != 0x30);
          bVar6 = (byte)uVar9 & 7;
          uVar11 = uVar14 >> bVar6;
          if ((uVar11 & 0x1e000000e00) == 0xa000000000) {
            uVar12 = ((uint)(uVar11 >> 0x10) & 0x100000 | (uint)(uVar11 >> 0xd) & 0xfffff) +
                     (uVar2 >> 4);
            uVar14 = ((ulong)(uVar12 & 0x100000) << 0x10 |
                     (ulong)(uVar12 & 0xfffff) << 0xd | uVar11 & 0xfffffeae000011ff) << bVar6 |
                     (ulong)((uint)uVar14 & ~(-1 << bVar6));
            lVar7 = 8;
            auVar16 = auVar3;
            do {
              if (SUB164(auVar16 ^ auVar4,4) == -0x80000000 &&
                  SUB164(auVar16 ^ auVar4,0) < -0x7ffffffa) {
                *pbVar13 = (byte)(uVar14 >> ((byte)lVar7 - 8 & 0x3f));
                pbVar13[1] = (byte)(uVar14 >> ((byte)lVar7 & 0x3f));
              }
              lVar17 = auVar16._8_8_;
              auVar16._0_8_ = auVar16._0_8_ + 2;
              auVar16._8_8_ = lVar17 + 2;
              lVar7 = lVar7 + 0x10;
              pbVar13 = pbVar13 + 2;
            } while (lVar7 != 0x38);
          }
        }
        uVar8 = uVar8 + 1;
        uVar9 = uVar9 + 0x29;
      } while (uVar8 != 3);
      uVar5 = uVar5 + 0x10;
      pBVar15 = pBVar15 + 0x10;
    } while (uVar5 <= size - 0x10);
  }
  return uVar5;
}

Assistant:

SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}